

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleDatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DoubleDatatypeValidator::checkContent
          (DoubleDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  DatatypeValidator *pDVar1;
  RefVectorOf<xercesc_4_0::XMLNumber> *pRVar2;
  XMLSize_t XVar3;
  bool bVar4;
  int iVar5;
  XMLNumber *pXVar6;
  InvalidDatatypeValueException *pIVar7;
  XMLSize_t getAt;
  XMLDouble theValue;
  
  pDVar1 = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
           super_DatatypeValidator.fBaseValidator;
  if (pDVar1 != (DatatypeValidator *)0x0) {
    (*(pDVar1->super_XSerializable)._vptr_XSerializable[0x11])(pDVar1,content,context,1,manager);
  }
  if (((this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
       super_DatatypeValidator.fFacetsDefined & 8) != 0) {
    bVar4 = RegularExpression::matches
                      ((this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                       super_DatatypeValidator.fRegex,content,manager);
    if (!bVar4) {
      pIVar7 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeValueException::InvalidDatatypeValueException
                (pIVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DoubleDatatypeValidator.cpp"
                 ,0xc5,VALUE_NotMatch_Pattern,content,
                 (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                 super_DatatypeValidator.fPattern,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      __cxa_throw(pIVar7,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
    }
  }
  if (!asBase) {
    XMLDouble::XMLDouble(&theValue,content,manager);
    pRVar2 = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.fEnumeration
    ;
    if (pRVar2 != (RefVectorOf<xercesc_4_0::XMLNumber> *)0x0) {
      XVar3 = (pRVar2->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>).fCurCount;
      getAt = 0;
      do {
        if (XVar3 == getAt) {
LAB_002f09da:
          pIVar7 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
          InvalidDatatypeValueException::InvalidDatatypeValueException
                    (pIVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DoubleDatatypeValidator.cpp"
                     ,0xdc,VALUE_NotIn_Enumeration,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                     manager);
          __cxa_throw(pIVar7,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
        }
        pXVar6 = BaseRefVectorOf<xercesc_4_0::XMLNumber>::elementAt
                           (&((this->super_AbstractNumericValidator).
                              super_AbstractNumericFacetValidator.fEnumeration)->
                             super_BaseRefVectorOf<xercesc_4_0::XMLNumber>,getAt);
        iVar5 = (*(this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                  super_DatatypeValidator.super_XSerializable._vptr_XSerializable[0x10])
                          (this,&theValue,pXVar6);
        if (iVar5 == 0) {
          if (XVar3 != getAt) break;
          goto LAB_002f09da;
        }
        getAt = getAt + 1;
      } while( true );
    }
    AbstractNumericValidator::boundsCheck
              (&this->super_AbstractNumericValidator,(XMLNumber *)&theValue,manager);
    XMLDouble::~XMLDouble(&theValue);
  }
  return;
}

Assistant:

void DoubleDatatypeValidator::checkContent(const XMLCh*             const content
                                          ,      ValidationContext* const context
                                          ,      bool                     asBase
                                          ,      MemoryManager*     const manager)
{

    //validate against base validator if any
    DoubleDatatypeValidator *pBase = (DoubleDatatypeValidator*) this->getBaseValidator();
    if (pBase)
        pBase->checkContent(content, context, true, manager);

    // we check pattern first
    if ( (getFacetsDefined() & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    XMLDouble theValue(content, manager);
    XMLDouble *theData = &theValue;

    if (getEnumeration())
    {
        XMLSize_t i=0;
        XMLSize_t enumLength = getEnumeration()->size();
        for ( ; i < enumLength; i++)
        {
            if (compareValues(theData, (XMLDouble*) getEnumeration()->elementAt(i)) ==0 )
                break;
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }

    boundsCheck(theData, manager);
}